

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cshutdn.c
# Opt level: O0

void Curl_cshutdn_destroy(cshutdn *cshutdn,Curl_easy *data)

{
  size_t sVar1;
  int timeout_ms;
  Curl_easy *data_local;
  cshutdn *cshutdn_local;
  
  if (((cshutdn->field_0x28 & 1) != 0) && (data != (Curl_easy *)0x0)) {
    if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
       ((((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)) &&
        (0 < Curl_trc_feat_multi.log_level)))) {
      sVar1 = Curl_llist_count(&cshutdn->list);
      Curl_trc_multi(data,"[SHUTDOWN] destroy, %zu connections, timeout=%dms",sVar1,0);
    }
    cshutdn_terminate_all(cshutdn,data,0);
  }
  cshutdn->multi = (Curl_multi *)0x0;
  return;
}

Assistant:

void Curl_cshutdn_destroy(struct cshutdn *cshutdn,
                          struct Curl_easy *data)
{
  if(cshutdn->initialised && data) {
    int timeout_ms = 0;
    /* Just for testing, run graceful shutdown */
#ifdef DEBUGBUILD
    {
      const char *p = getenv("CURL_GRACEFUL_SHUTDOWN");
      if(p) {
        curl_off_t l;
        if(!Curl_str_number(&p, &l, INT_MAX))
          timeout_ms = (int)l;
      }
    }
#endif

    CURL_TRC_M(data, "[SHUTDOWN] destroy, %zu connections, timeout=%dms",
               Curl_llist_count(&cshutdn->list), timeout_ms);
    cshutdn_terminate_all(cshutdn, data, timeout_ms);
  }
  cshutdn->multi = NULL;
}